

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  AABBNodeMB4D *node1;
  ulong uVar56;
  long lVar57;
  uint uVar58;
  int iVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong *puVar70;
  long lVar71;
  ulong uVar72;
  RTCIntersectArguments *pRVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [32];
  float fVar90;
  float fVar91;
  float fVar96;
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [32];
  float fVar105;
  float fVar109;
  undefined1 auVar104 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar121;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar132;
  float fVar133;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar129 [32];
  float fVar134;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar142 [32];
  float fVar144;
  float fVar146;
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 auVar143 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar166;
  float fVar170;
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  float fVar172;
  undefined1 auVar171 [64];
  float fVar173;
  undefined1 auVar174 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar175 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [64];
  float fVar199;
  float fVar200;
  undefined1 auVar201 [32];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar202 [64];
  float fVar215;
  float fVar217;
  undefined1 auVar216 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  float fVar221;
  float fVar222;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar223 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_de4;
  undefined8 local_de0;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined1 local_d90 [16];
  undefined1 local_d80 [16];
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [16];
  undefined1 local_d40 [16];
  undefined1 local_d30 [16];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [8];
  float fStack_ce8;
  float fStack_ce4;
  undefined1 local_ce0 [8];
  float fStack_cd8;
  float fStack_cd4;
  long local_cd0;
  long local_cc8;
  ulong local_cc0;
  ulong local_cb8;
  long local_cb0;
  ulong local_ca8;
  undefined4 local_ca0;
  undefined4 local_c9c;
  float local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  uint local_c88;
  uint local_c84;
  uint local_c80;
  RTCFilterFunctionNArguments local_c70;
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b60 [32];
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined4 uStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_800 != 8) && (fVar122 = ray->tfar, 0.0 <= fVar122)) {
    puVar70 = local_7f8;
    aVar5 = (ray->dir).field_0;
    auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar81._8_4_ = 0x7fffffff;
    auVar81._0_8_ = 0x7fffffff7fffffff;
    auVar81._12_4_ = 0x7fffffff;
    auVar81 = vandps_avx((undefined1  [16])aVar5,auVar81);
    auVar123._8_4_ = 0x219392ef;
    auVar123._0_8_ = 0x219392ef219392ef;
    auVar123._12_4_ = 0x219392ef;
    auVar81 = vcmpps_avx(auVar81,auVar123,1);
    auVar124._8_4_ = 0x3f800000;
    auVar124._0_8_ = 0x3f8000003f800000;
    auVar124._12_4_ = 0x3f800000;
    auVar123 = vdivps_avx(auVar124,(undefined1  [16])aVar5);
    auVar125._8_4_ = 0x5d5e0b6b;
    auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar125._12_4_ = 0x5d5e0b6b;
    auVar81 = vblendvps_avx(auVar123,auVar125,auVar81);
    auVar110._0_4_ = auVar81._0_4_ * 0.99999964;
    auVar110._4_4_ = auVar81._4_4_ * 0.99999964;
    auVar110._8_4_ = auVar81._8_4_ * 0.99999964;
    auVar110._12_4_ = auVar81._12_4_ * 0.99999964;
    auVar98._0_4_ = auVar81._0_4_ * 1.0000004;
    auVar98._4_4_ = auVar81._4_4_ * 1.0000004;
    auVar98._8_4_ = auVar81._8_4_ * 1.0000004;
    auVar98._12_4_ = auVar81._12_4_ * 1.0000004;
    uVar3 = *(undefined4 *)&(ray->org).field_0;
    auVar163 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar171 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar175 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    auVar81 = vshufps_avx(auVar110,auVar110,0);
    auVar189 = ZEXT1664(auVar81);
    auVar81 = vmovshdup_avx(auVar110);
    auVar123 = vshufps_avx(auVar110,auVar110,0x55);
    auVar192 = ZEXT1664(auVar123);
    auVar123 = vshufpd_avx(auVar110,auVar110,1);
    auVar124 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar202 = ZEXT1664(auVar124);
    auVar124 = vshufps_avx(auVar98,auVar98,0);
    auVar216 = ZEXT1664(auVar124);
    auVar124 = vshufps_avx(auVar98,auVar98,0x55);
    auVar220 = ZEXT1664(auVar124);
    auVar124 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar223 = ZEXT1664(auVar124);
    uVar74 = (ulong)(auVar110._0_4_ < 0.0) * 0x10;
    uVar77 = (ulong)(auVar81._0_4_ < 0.0) << 4 | 0x20;
    uVar78 = (ulong)(auVar123._0_4_ < 0.0) << 4 | 0x40;
    auVar81 = vshufps_avx(auVar82,auVar82,0);
    auVar143 = ZEXT1664(auVar81);
    local_a50 = vshufps_avx(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),0);
    local_a20._16_16_ = mm_lookupmask_ps._240_16_;
    local_a20._0_16_ = mm_lookupmask_ps._0_16_;
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar83._8_4_ = 0xbf800000;
    auVar83._0_8_ = 0xbf800000bf800000;
    auVar83._12_4_ = 0xbf800000;
    auVar83._16_4_ = 0xbf800000;
    auVar83._20_4_ = 0xbf800000;
    auVar83._24_4_ = 0xbf800000;
    auVar83._28_4_ = 0xbf800000;
    local_a40 = vblendvps_avx(auVar116,auVar83,local_a20);
    do {
      uVar63 = puVar70[-1];
      puVar70 = puVar70 + -1;
      while( true ) {
        local_d00 = auVar163._0_16_;
        local_d10 = auVar171._0_16_;
        local_d20 = auVar175._0_16_;
        if ((uVar63 & 8) != 0) break;
        uVar56 = uVar63 & 0xfffffffffffffff0;
        fVar122 = (ray->dir).field_0.m128[3];
        auVar80._4_4_ = fVar122;
        auVar80._0_4_ = fVar122;
        auVar80._8_4_ = fVar122;
        auVar80._12_4_ = fVar122;
        pfVar2 = (float *)(uVar56 + 0x80 + uVar74);
        pfVar1 = (float *)(uVar56 + 0x20 + uVar74);
        auVar92._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar92._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar92._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar92._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar81 = vsubps_avx(auVar92,local_d00);
        auVar93._0_4_ = auVar189._0_4_ * auVar81._0_4_;
        auVar93._4_4_ = auVar189._4_4_ * auVar81._4_4_;
        auVar93._8_4_ = auVar189._8_4_ * auVar81._8_4_;
        auVar93._12_4_ = auVar189._12_4_ * auVar81._12_4_;
        pfVar2 = (float *)(uVar56 + 0x80 + uVar77);
        auVar81 = vmaxps_avx(auVar143._0_16_,auVar93);
        pfVar1 = (float *)(uVar56 + 0x20 + uVar77);
        auVar99._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar99._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar99._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar99._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar123 = vsubps_avx(auVar99,local_d10);
        pfVar2 = (float *)(uVar56 + 0x80 + uVar78);
        pfVar1 = (float *)(uVar56 + 0x20 + uVar78);
        auVar111._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar111._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar111._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar111._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar100._0_4_ = auVar192._0_4_ * auVar123._0_4_;
        auVar100._4_4_ = auVar192._4_4_ * auVar123._4_4_;
        auVar100._8_4_ = auVar192._8_4_ * auVar123._8_4_;
        auVar100._12_4_ = auVar192._12_4_ * auVar123._12_4_;
        auVar123 = vsubps_avx(auVar111,local_d20);
        auVar112._0_4_ = auVar202._0_4_ * auVar123._0_4_;
        auVar112._4_4_ = auVar202._4_4_ * auVar123._4_4_;
        auVar112._8_4_ = auVar202._8_4_ * auVar123._8_4_;
        auVar112._12_4_ = auVar202._12_4_ * auVar123._12_4_;
        auVar123 = vmaxps_avx(auVar100,auVar112);
        pfVar2 = (float *)(uVar56 + 0x80 + (uVar74 ^ 0x10));
        pfVar1 = (float *)(uVar56 + 0x20 + (uVar74 ^ 0x10));
        auVar113._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar113._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar113._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar113._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar81 = vmaxps_avx(auVar81,auVar123);
        auVar123 = vsubps_avx(auVar113,local_d00);
        auVar101._0_4_ = auVar216._0_4_ * auVar123._0_4_;
        auVar101._4_4_ = auVar216._4_4_ * auVar123._4_4_;
        auVar101._8_4_ = auVar216._8_4_ * auVar123._8_4_;
        auVar101._12_4_ = auVar216._12_4_ * auVar123._12_4_;
        auVar123 = vminps_avx(local_a50,auVar101);
        pfVar2 = (float *)(uVar56 + 0x80 + (uVar77 ^ 0x10));
        pfVar1 = (float *)(uVar56 + 0x20 + (uVar77 ^ 0x10));
        auVar114._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar114._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar114._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar114._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar82 = vsubps_avx(auVar114,local_d10);
        auVar115._0_4_ = auVar220._0_4_ * auVar82._0_4_;
        auVar115._4_4_ = auVar220._4_4_ * auVar82._4_4_;
        auVar115._8_4_ = auVar220._8_4_ * auVar82._8_4_;
        auVar115._12_4_ = auVar220._12_4_ * auVar82._12_4_;
        pfVar2 = (float *)(uVar56 + 0x80 + (uVar78 ^ 0x10));
        pfVar1 = (float *)(uVar56 + 0x20 + (uVar78 ^ 0x10));
        auVar126._0_4_ = fVar122 * *pfVar2 + *pfVar1;
        auVar126._4_4_ = fVar122 * pfVar2[1] + pfVar1[1];
        auVar126._8_4_ = fVar122 * pfVar2[2] + pfVar1[2];
        auVar126._12_4_ = fVar122 * pfVar2[3] + pfVar1[3];
        auVar82 = vsubps_avx(auVar126,local_d20);
        auVar127._0_4_ = auVar223._0_4_ * auVar82._0_4_;
        auVar127._4_4_ = auVar223._4_4_ * auVar82._4_4_;
        auVar127._8_4_ = auVar223._8_4_ * auVar82._8_4_;
        auVar127._12_4_ = auVar223._12_4_ * auVar82._12_4_;
        auVar82 = vminps_avx(auVar115,auVar127);
        auVar123 = vminps_avx(auVar123,auVar82);
        if (((uint)uVar63 & 7) == 6) {
          auVar123 = vcmpps_avx(auVar81,auVar123,2);
          auVar81 = vcmpps_avx(*(undefined1 (*) [16])(uVar56 + 0xe0),auVar80,2);
          auVar82 = vcmpps_avx(auVar80,*(undefined1 (*) [16])(uVar56 + 0xf0),1);
          auVar81 = vandps_avx(auVar81,auVar82);
          auVar81 = vandps_avx(auVar81,auVar123);
        }
        else {
          auVar81 = vcmpps_avx(auVar81,auVar123,2);
        }
        auVar81 = vpslld_avx(auVar81,0x1f);
        uVar58 = vmovmskps_avx(auVar81);
        if (uVar58 == 0) goto LAB_002c7ca3;
        lVar11 = 0;
        if ((byte)uVar58 != 0) {
          for (; ((byte)uVar58 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        uVar63 = *(ulong *)(uVar56 + lVar11 * 8);
        uVar58 = (uVar58 & 0xff) - 1 & uVar58 & 0xff;
        if (uVar58 != 0) {
          *puVar70 = uVar63;
          puVar70 = puVar70 + 1;
          lVar11 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar63 = *(ulong *)(uVar56 + lVar11 * 8);
          uVar58 = uVar58 - 1 & uVar58;
          uVar60 = (ulong)uVar58;
          if (uVar58 != 0) {
            do {
              *puVar70 = uVar63;
              puVar70 = puVar70 + 1;
              lVar11 = 0;
              if (uVar60 != 0) {
                for (; (uVar60 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar63 = *(ulong *)(uVar56 + lVar11 * 8);
              uVar60 = uVar60 & uVar60 - 1;
            } while (uVar60 != 0);
          }
        }
      }
      local_cd0 = (ulong)((uint)uVar63 & 0xf) - 8;
      if (local_cd0 != 0) {
        uVar63 = uVar63 & 0xfffffffffffffff0;
        pSVar6 = context->scene;
        local_cc8 = 0;
        local_d30 = auVar189._0_16_;
        local_d40 = auVar192._0_16_;
        local_d50 = auVar202._0_16_;
        local_d60 = auVar216._0_16_;
        local_d70 = auVar220._0_16_;
        local_d80 = auVar223._0_16_;
        local_d90 = auVar143._0_16_;
        do {
          lVar57 = local_cc8 * 0x60;
          pRVar7 = (pSVar6->geometries).items;
          pGVar8 = pRVar7[*(uint *)(uVar63 + 0x40 + lVar57)].ptr;
          fVar122 = (pGVar8->time_range).lower;
          fVar122 = pGVar8->fnumTimeSegments *
                    (((ray->dir).field_0.m128[3] - fVar122) / ((pGVar8->time_range).upper - fVar122)
                    );
          auVar81 = vroundss_avx(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),9);
          auVar81 = vminss_avx(auVar81,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar218 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
          iVar59 = (int)auVar218._0_4_;
          lVar71 = (long)iVar59 * 0x38;
          lVar11 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar71);
          uVar69 = (ulong)*(uint *)(uVar63 + 4 + lVar57);
          auVar81 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar63 + lVar57) * 4);
          uVar60 = (ulong)*(uint *)(uVar63 + 0x10 + lVar57);
          auVar123 = *(undefined1 (*) [16])(lVar11 + uVar60 * 4);
          uVar62 = (ulong)*(uint *)(uVar63 + 0x20 + lVar57);
          auVar82 = *(undefined1 (*) [16])(lVar11 + uVar62 * 4);
          uVar64 = (ulong)*(uint *)(uVar63 + 0x30 + lVar57);
          auVar124 = *(undefined1 (*) [16])(lVar11 + uVar64 * 4);
          local_cb0 = *(long *)&pRVar7[*(uint *)(uVar63 + 0x44 + lVar57)].ptr[2].numPrimitives;
          lVar11 = *(long *)(local_cb0 + lVar71);
          auVar98 = *(undefined1 (*) [16])(lVar11 + uVar69 * 4);
          uVar65 = (ulong)*(uint *)(uVar63 + 0x14 + lVar57);
          auVar110 = *(undefined1 (*) [16])(lVar11 + uVar65 * 4);
          uVar66 = (ulong)*(uint *)(uVar63 + 0x24 + lVar57);
          auVar125 = *(undefined1 (*) [16])(lVar11 + uVar66 * 4);
          uVar67 = (ulong)*(uint *)(uVar63 + 0x34 + lVar57);
          auVar80 = *(undefined1 (*) [16])(lVar11 + uVar67 * 4);
          lVar11 = *(long *)&pRVar7[*(uint *)(uVar63 + 0x48 + lVar57)].ptr[2].numPrimitives;
          lVar9 = *(long *)(lVar11 + lVar71);
          uVar68 = (ulong)*(uint *)(uVar63 + 8 + lVar57);
          auVar128 = *(undefined1 (*) [16])(lVar9 + uVar68 * 4);
          local_ca8 = (ulong)*(uint *)(uVar63 + 0x18 + lVar57);
          auVar102 = *(undefined1 (*) [16])(lVar9 + local_ca8 * 4);
          uVar75 = CONCAT44(0,*(uint *)(uVar63 + 0x28 + lVar57));
          local_be0._0_8_ = uVar75;
          auVar140 = *(undefined1 (*) [16])(lVar9 + uVar75 * 4);
          uVar76 = (ulong)*(uint *)(uVar63 + 0x38 + lVar57);
          auVar160 = *(undefined1 (*) [16])(lVar9 + uVar76 * 4);
          fVar122 = fVar122 - auVar218._0_4_;
          lVar9 = *(long *)&pRVar7[*(uint *)(uVar63 + 0x4c + lVar57)].ptr[2].numPrimitives;
          lVar71 = *(long *)(lVar9 + lVar71);
          uVar56 = (ulong)*(uint *)(uVar63 + 0xc + lVar57);
          auVar218 = *(undefined1 (*) [16])(lVar71 + uVar56 * 4);
          local_cc0 = (ulong)*(uint *)(uVar63 + 0x1c + lVar57);
          auVar92 = *(undefined1 (*) [16])(lVar71 + local_cc0 * 4);
          auVar93 = vunpcklps_avx(auVar81,auVar128);
          auVar128 = vunpckhps_avx(auVar81,auVar128);
          auVar99 = vunpcklps_avx(auVar98,auVar218);
          auVar98 = vunpckhps_avx(auVar98,auVar218);
          uVar72 = (ulong)*(uint *)(uVar63 + 0x2c + lVar57);
          auVar81 = *(undefined1 (*) [16])(lVar71 + uVar72 * 4);
          auVar218 = vunpcklps_avx(auVar128,auVar98);
          _local_a60 = vunpcklps_avx(auVar93,auVar99);
          auVar55 = _local_a60;
          auVar98 = vunpckhps_avx(auVar93,auVar99);
          auVar93 = vunpcklps_avx(auVar123,auVar102);
          auVar128 = vunpckhps_avx(auVar123,auVar102);
          auVar102 = vunpcklps_avx(auVar110,auVar92);
          auVar110 = vunpckhps_avx(auVar110,auVar92);
          local_cb8 = (ulong)*(uint *)(uVar63 + 0x3c + lVar57);
          auVar123 = *(undefined1 (*) [16])(lVar71 + local_cb8 * 4);
          auVar128 = vunpcklps_avx(auVar128,auVar110);
          auVar92 = vunpcklps_avx(auVar93,auVar102);
          auVar110 = vunpckhps_avx(auVar93,auVar102);
          auVar102 = vunpcklps_avx(auVar82,auVar140);
          auVar82 = vunpckhps_avx(auVar82,auVar140);
          auVar140 = vunpcklps_avx(auVar125,auVar81);
          auVar125 = vunpckhps_avx(auVar125,auVar81);
          lVar61 = (long)(iVar59 + 1) * 0x38;
          lVar71 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar61);
          auVar81 = *(undefined1 (*) [16])(lVar71 + (ulong)*(uint *)(uVar63 + lVar57) * 4);
          _local_ce0 = vunpcklps_avx(auVar82,auVar125);
          auVar126 = _local_ce0;
          _local_a90 = vunpcklps_avx(auVar102,auVar140);
          auVar127 = _local_a90;
          _local_a80 = vunpckhps_avx(auVar102,auVar140);
          auVar53 = _local_a80;
          auVar125 = vunpcklps_avx(auVar124,auVar160);
          auVar82 = vunpckhps_avx(auVar124,auVar160);
          auVar102 = vunpcklps_avx(auVar80,auVar123);
          auVar124 = vunpckhps_avx(auVar80,auVar123);
          lVar11 = *(long *)(lVar11 + lVar61);
          auVar123 = *(undefined1 (*) [16])(lVar11 + uVar68 * 4);
          _local_cf0 = vunpcklps_avx(auVar82,auVar124);
          auVar115 = _local_cf0;
          auVar140 = vunpcklps_avx(auVar125,auVar102);
          _local_a70 = vunpckhps_avx(auVar125,auVar102);
          auVar54 = _local_a70;
          lVar10 = *(long *)(local_cb0 + lVar61);
          auVar124 = vunpcklps_avx(auVar81,auVar123);
          auVar82 = vunpckhps_avx(auVar81,auVar123);
          auVar81 = *(undefined1 (*) [16])(lVar10 + uVar69 * 4);
          lVar9 = *(long *)(lVar9 + lVar61);
          auVar123 = *(undefined1 (*) [16])(lVar9 + uVar56 * 4);
          auVar125 = vunpcklps_avx(auVar81,auVar123);
          auVar81 = vunpckhps_avx(auVar81,auVar123);
          auVar102 = vunpcklps_avx(auVar82,auVar81);
          auVar160 = vunpcklps_avx(auVar124,auVar125);
          auVar82 = vunpckhps_avx(auVar124,auVar125);
          auVar81 = *(undefined1 (*) [16])(lVar71 + uVar60 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar11 + local_ca8 * 4);
          auVar125 = vunpcklps_avx(auVar81,auVar123);
          auVar124 = vunpckhps_avx(auVar81,auVar123);
          auVar81 = *(undefined1 (*) [16])(lVar10 + uVar65 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar9 + local_cc0 * 4);
          auVar80 = vunpcklps_avx(auVar81,auVar123);
          auVar81 = vunpckhps_avx(auVar81,auVar123);
          auVar93 = vunpcklps_avx(auVar124,auVar81);
          auVar99 = vunpcklps_avx(auVar125,auVar80);
          auVar124 = vunpckhps_avx(auVar125,auVar80);
          auVar81 = *(undefined1 (*) [16])(lVar71 + uVar62 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar11 + uVar75 * 4);
          auVar80 = vunpcklps_avx(auVar81,auVar123);
          auVar125 = vunpckhps_avx(auVar81,auVar123);
          auVar81 = *(undefined1 (*) [16])(lVar10 + uVar66 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar9 + uVar72 * 4);
          auVar100 = vunpcklps_avx(auVar81,auVar123);
          auVar81 = vunpckhps_avx(auVar81,auVar123);
          auVar101 = vunpcklps_avx(auVar125,auVar81);
          auVar111 = vunpcklps_avx(auVar80,auVar100);
          auVar125 = vunpckhps_avx(auVar80,auVar100);
          auVar81 = *(undefined1 (*) [16])(lVar71 + uVar64 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar11 + uVar76 * 4);
          auVar100 = vunpcklps_avx(auVar81,auVar123);
          auVar80 = vunpckhps_avx(auVar81,auVar123);
          auVar81 = *(undefined1 (*) [16])(lVar10 + uVar67 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar9 + local_cb8 * 4);
          auVar112 = vunpcklps_avx(auVar81,auVar123);
          auVar81 = vunpckhps_avx(auVar81,auVar123);
          auVar113 = vunpcklps_avx(auVar80,auVar81);
          auVar114 = vunpcklps_avx(auVar100,auVar112);
          auVar80 = vunpckhps_avx(auVar100,auVar112);
          auVar81 = vshufps_avx(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),0);
          auVar123 = vshufps_avx(ZEXT416((uint)(1.0 - fVar122)),ZEXT416((uint)(1.0 - fVar122)),0);
          fVar122 = auVar81._0_4_;
          fVar15 = auVar81._4_4_;
          fVar16 = auVar81._8_4_;
          fVar17 = auVar81._12_4_;
          fVar90 = auVar123._0_4_;
          fVar96 = auVar123._4_4_;
          fVar97 = auVar123._8_4_;
          fVar105 = auVar123._12_4_;
          auVar94._4_4_ = fVar96 * (float)local_a60._4_4_ + auVar160._4_4_ * fVar15;
          auVar94._0_4_ = fVar90 * (float)local_a60._0_4_ + auVar160._0_4_ * fVar122;
          auVar94._8_4_ = fVar97 * fStack_a58 + auVar160._8_4_ * fVar16;
          auVar94._12_4_ = fVar105 * fStack_a54 + auVar160._12_4_ * fVar17;
          local_ba0._0_4_ = auVar98._0_4_;
          local_ba0._4_4_ = auVar98._4_4_;
          fStack_b98 = auVar98._8_4_;
          fStack_b94 = auVar98._12_4_;
          auVar117._4_4_ = fVar96 * (float)local_ba0._4_4_ + fVar15 * auVar82._4_4_;
          auVar117._0_4_ = fVar90 * (float)local_ba0._0_4_ + fVar122 * auVar82._0_4_;
          auVar117._8_4_ = fVar97 * fStack_b98 + fVar16 * auVar82._8_4_;
          auVar117._12_4_ = fVar105 * fStack_b94 + fVar17 * auVar82._12_4_;
          local_b40._0_4_ = auVar218._0_4_;
          local_b40._4_4_ = auVar218._4_4_;
          fStack_b38 = auVar218._8_4_;
          fStack_b34 = auVar218._12_4_;
          auVar156._4_4_ = fVar96 * (float)local_b40._4_4_ + auVar102._4_4_ * fVar15;
          auVar156._0_4_ = fVar90 * (float)local_b40._0_4_ + auVar102._0_4_ * fVar122;
          auVar156._8_4_ = fVar97 * fStack_b38 + auVar102._8_4_ * fVar16;
          auVar156._12_4_ = fVar105 * fStack_b34 + auVar102._12_4_ * fVar17;
          local_bc0._0_4_ = auVar92._0_4_;
          local_bc0._4_4_ = auVar92._4_4_;
          fStack_bb8 = auVar92._8_4_;
          fStack_bb4 = auVar92._12_4_;
          auVar160._0_4_ = fVar90 * (float)local_bc0._0_4_ + fVar122 * auVar99._0_4_;
          auVar160._4_4_ = fVar96 * (float)local_bc0._4_4_ + fVar15 * auVar99._4_4_;
          auVar160._8_4_ = fVar97 * fStack_bb8 + fVar16 * auVar99._8_4_;
          auVar160._12_4_ = fVar105 * fStack_bb4 + fVar17 * auVar99._12_4_;
          local_b80._0_4_ = auVar110._0_4_;
          local_b80._4_4_ = auVar110._4_4_;
          fStack_b78 = auVar110._8_4_;
          fStack_b74 = auVar110._12_4_;
          auVar102._0_4_ = fVar90 * (float)local_b80._0_4_ + auVar124._0_4_ * fVar122;
          auVar102._4_4_ = fVar96 * (float)local_b80._4_4_ + auVar124._4_4_ * fVar15;
          auVar102._8_4_ = fVar97 * fStack_b78 + auVar124._8_4_ * fVar16;
          auVar102._12_4_ = fVar105 * fStack_b74 + auVar124._12_4_ * fVar17;
          local_b20._0_4_ = auVar128._0_4_;
          local_b20._4_4_ = auVar128._4_4_;
          fStack_b18 = auVar128._8_4_;
          fStack_b14 = auVar128._12_4_;
          auVar218._0_4_ = fVar90 * (float)local_b20._0_4_ + auVar93._0_4_ * fVar122;
          auVar218._4_4_ = fVar96 * (float)local_b20._4_4_ + auVar93._4_4_ * fVar15;
          auVar218._8_4_ = fVar97 * fStack_b18 + auVar93._8_4_ * fVar16;
          auVar218._12_4_ = fVar105 * fStack_b14 + auVar93._12_4_ * fVar17;
          auVar94._20_4_ = fVar96 * (float)local_a90._4_4_ + fVar15 * auVar111._4_4_;
          auVar94._16_4_ = fVar90 * (float)local_a90._0_4_ + fVar122 * auVar111._0_4_;
          auVar94._24_4_ = fVar97 * fStack_a88 + fVar16 * auVar111._8_4_;
          auVar94._28_4_ = fVar105 * fStack_a84 + fVar17 * auVar111._12_4_;
          auVar117._20_4_ = fVar96 * (float)local_a80._4_4_ + auVar125._4_4_ * fVar15;
          auVar117._16_4_ = fVar90 * (float)local_a80._0_4_ + auVar125._0_4_ * fVar122;
          auVar117._24_4_ = fVar97 * fStack_a78 + auVar125._8_4_ * fVar16;
          auVar117._28_4_ = fVar105 * fStack_a74 + auVar125._12_4_ * fVar17;
          auVar156._20_4_ = fVar96 * (float)local_ce0._4_4_ + auVar101._4_4_ * fVar15;
          auVar156._16_4_ = fVar90 * (float)local_ce0._0_4_ + auVar101._0_4_ * fVar122;
          auVar156._24_4_ = fVar97 * fStack_cd8 + auVar101._8_4_ * fVar16;
          auVar156._28_4_ = fVar105 * fStack_cd4 + auVar101._12_4_ * fVar17;
          lVar11 = uVar63 + 0x40 + lVar57;
          local_9e0 = *(undefined8 *)(lVar11 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar11 + 0x18);
          auVar128._0_4_ = auVar140._0_4_ * fVar90 + fVar122 * auVar114._0_4_;
          auVar128._4_4_ = auVar140._4_4_ * fVar96 + fVar15 * auVar114._4_4_;
          auVar128._8_4_ = auVar140._8_4_ * fVar97 + fVar16 * auVar114._8_4_;
          auVar128._12_4_ = auVar140._12_4_ * fVar105 + fVar17 * auVar114._12_4_;
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          lVar57 = uVar63 + 0x50 + lVar57;
          local_a00 = *(undefined8 *)(lVar57 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar57 + 0x18);
          auVar140._0_4_ = fVar90 * (float)local_a70._0_4_ + fVar122 * auVar80._0_4_;
          auVar140._4_4_ = fVar96 * (float)local_a70._4_4_ + fVar15 * auVar80._4_4_;
          auVar140._8_4_ = fVar97 * fStack_a68 + fVar16 * auVar80._8_4_;
          auVar140._12_4_ = fVar105 * fStack_a64 + fVar17 * auVar80._12_4_;
          auVar82._0_4_ = fVar90 * (float)local_cf0._0_4_ + fVar122 * auVar113._0_4_;
          auVar82._4_4_ = fVar96 * (float)local_cf0._4_4_ + fVar15 * auVar113._4_4_;
          auVar82._8_4_ = fVar97 * fStack_ce8 + fVar16 * auVar113._8_4_;
          auVar82._12_4_ = fVar105 * fStack_ce4 + fVar17 * auVar113._12_4_;
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar161._16_16_ = auVar160;
          auVar161._0_16_ = auVar160;
          auVar103._16_16_ = auVar102;
          auVar103._0_16_ = auVar102;
          auVar219._16_16_ = auVar218;
          auVar219._0_16_ = auVar218;
          auVar129._16_16_ = auVar128;
          auVar129._0_16_ = auVar128;
          auVar141._16_16_ = auVar140;
          auVar141._0_16_ = auVar140;
          auVar174._16_16_ = auVar82;
          auVar174._0_16_ = auVar82;
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar188._4_4_ = uVar3;
          auVar188._0_4_ = uVar3;
          auVar188._8_4_ = uVar3;
          auVar188._12_4_ = uVar3;
          auVar188._16_4_ = uVar3;
          auVar188._20_4_ = uVar3;
          auVar188._24_4_ = uVar3;
          auVar188._28_4_ = uVar3;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar191._4_4_ = uVar4;
          auVar191._0_4_ = uVar4;
          auVar191._8_4_ = uVar4;
          auVar191._12_4_ = uVar4;
          auVar191._16_4_ = uVar4;
          auVar191._20_4_ = uVar4;
          auVar191._24_4_ = uVar4;
          auVar191._28_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar201._4_4_ = uVar4;
          auVar201._0_4_ = uVar4;
          auVar201._8_4_ = uVar4;
          auVar201._12_4_ = uVar4;
          auVar201._16_4_ = uVar4;
          auVar201._20_4_ = uVar4;
          auVar201._24_4_ = uVar4;
          auVar201._28_4_ = uVar4;
          local_c00 = vsubps_avx(auVar94,auVar188);
          local_c20 = vsubps_avx(auVar117,auVar191);
          local_c40 = vsubps_avx(auVar156,auVar201);
          auVar83 = vsubps_avx(auVar161,auVar188);
          auVar116 = vsubps_avx(auVar103,auVar191);
          auVar18 = vsubps_avx(auVar219,auVar201);
          auVar94 = vsubps_avx(auVar129,auVar188);
          auVar19 = vsubps_avx(auVar141,auVar191);
          auVar20 = vsubps_avx(auVar174,auVar201);
          local_ac0 = vsubps_avx(auVar94,local_c00);
          local_ae0 = vsubps_avx(auVar19,local_c20);
          _local_b20 = vsubps_avx(auVar20,local_c40);
          fVar15 = local_c20._0_4_;
          fVar122 = auVar19._0_4_ + fVar15;
          fVar17 = local_c20._4_4_;
          fVar132 = auVar19._4_4_ + fVar17;
          fVar96 = local_c20._8_4_;
          fVar133 = auVar19._8_4_ + fVar96;
          fVar105 = local_c20._12_4_;
          fVar134 = auVar19._12_4_ + fVar105;
          fVar107 = local_c20._16_4_;
          fVar135 = auVar19._16_4_ + fVar107;
          fVar109 = local_c20._20_4_;
          fVar136 = auVar19._20_4_ + fVar109;
          fVar13 = local_c20._24_4_;
          fVar137 = auVar19._24_4_ + fVar13;
          fVar91 = local_c20._28_4_;
          fVar221 = local_c40._0_4_;
          fVar138 = fVar221 + auVar20._0_4_;
          fVar224 = local_c40._4_4_;
          fVar144 = fVar224 + auVar20._4_4_;
          fVar226 = local_c40._8_4_;
          fVar146 = fVar226 + auVar20._8_4_;
          fVar228 = local_c40._12_4_;
          fVar148 = fVar228 + auVar20._12_4_;
          fVar230 = local_c40._16_4_;
          fVar150 = fVar230 + auVar20._16_4_;
          fVar232 = local_c40._20_4_;
          fVar152 = fVar232 + auVar20._20_4_;
          fVar234 = local_c40._24_4_;
          fVar154 = fVar234 + auVar20._24_4_;
          fVar121 = local_c40._28_4_;
          fVar79 = local_b20._0_4_;
          fVar84 = local_b20._4_4_;
          auVar21._4_4_ = fVar84 * fVar132;
          auVar21._0_4_ = fVar79 * fVar122;
          fVar85 = local_b20._8_4_;
          auVar21._8_4_ = fVar85 * fVar133;
          fVar86 = local_b20._12_4_;
          auVar21._12_4_ = fVar86 * fVar134;
          fVar87 = local_b20._16_4_;
          auVar21._16_4_ = fVar87 * fVar135;
          fVar88 = local_b20._20_4_;
          auVar21._20_4_ = fVar88 * fVar136;
          fVar89 = local_b20._24_4_;
          auVar21._24_4_ = fVar89 * fVar137;
          auVar21._28_4_ = auVar160._12_4_;
          fVar199 = local_ae0._0_4_;
          fVar203 = local_ae0._4_4_;
          auVar22._4_4_ = fVar203 * fVar144;
          auVar22._0_4_ = fVar199 * fVar138;
          fVar205 = local_ae0._8_4_;
          auVar22._8_4_ = fVar205 * fVar146;
          fVar207 = local_ae0._12_4_;
          auVar22._12_4_ = fVar207 * fVar148;
          fVar209 = local_ae0._16_4_;
          auVar22._16_4_ = fVar209 * fVar150;
          fVar211 = local_ae0._20_4_;
          auVar22._20_4_ = fVar211 * fVar152;
          fVar213 = local_ae0._24_4_;
          auVar22._24_4_ = fVar213 * fVar154;
          auVar22._28_4_ = auVar82._12_4_;
          auVar21 = vsubps_avx(auVar22,auVar21);
          fVar16 = local_c00._0_4_;
          fVar159 = auVar94._0_4_ + fVar16;
          fVar90 = local_c00._4_4_;
          fVar164 = auVar94._4_4_ + fVar90;
          fVar97 = local_c00._8_4_;
          fVar165 = auVar94._8_4_ + fVar97;
          fVar106 = local_c00._12_4_;
          fVar166 = auVar94._12_4_ + fVar106;
          fVar108 = local_c00._16_4_;
          fVar167 = auVar94._16_4_ + fVar108;
          fVar12 = local_c00._20_4_;
          fVar168 = auVar94._20_4_ + fVar12;
          fVar14 = local_c00._24_4_;
          fVar169 = auVar94._24_4_ + fVar14;
          fVar190 = local_ac0._0_4_;
          fVar193 = local_ac0._4_4_;
          auVar23._4_4_ = fVar193 * fVar144;
          auVar23._0_4_ = fVar190 * fVar138;
          fVar194 = local_ac0._8_4_;
          auVar23._8_4_ = fVar194 * fVar146;
          fVar195 = local_ac0._12_4_;
          auVar23._12_4_ = fVar195 * fVar148;
          fVar196 = local_ac0._16_4_;
          auVar23._16_4_ = fVar196 * fVar150;
          fVar197 = local_ac0._20_4_;
          auVar23._20_4_ = fVar197 * fVar152;
          fVar198 = local_ac0._24_4_;
          auVar23._24_4_ = fVar198 * fVar154;
          auVar23._28_4_ = fVar121 + auVar20._28_4_;
          auVar103 = _local_b20;
          auVar24._4_4_ = fVar84 * fVar164;
          auVar24._0_4_ = fVar79 * fVar159;
          auVar24._8_4_ = fVar85 * fVar165;
          auVar24._12_4_ = fVar86 * fVar166;
          auVar24._16_4_ = fVar87 * fVar167;
          auVar24._20_4_ = fVar88 * fVar168;
          auVar24._24_4_ = fVar89 * fVar169;
          auVar24._28_4_ = uVar3;
          auVar22 = vsubps_avx(auVar24,auVar23);
          auVar25._4_4_ = fVar203 * fVar164;
          auVar25._0_4_ = fVar199 * fVar159;
          auVar25._8_4_ = fVar205 * fVar165;
          auVar25._12_4_ = fVar207 * fVar166;
          auVar25._16_4_ = fVar209 * fVar167;
          auVar25._20_4_ = fVar211 * fVar168;
          auVar25._24_4_ = fVar213 * fVar169;
          auVar25._28_4_ = auVar94._28_4_ + local_c00._28_4_;
          auVar26._4_4_ = fVar193 * fVar132;
          auVar26._0_4_ = fVar190 * fVar122;
          auVar26._8_4_ = fVar194 * fVar133;
          auVar26._12_4_ = fVar195 * fVar134;
          auVar26._16_4_ = fVar196 * fVar135;
          auVar26._20_4_ = fVar197 * fVar136;
          auVar26._24_4_ = fVar198 * fVar137;
          auVar26._28_4_ = auVar19._28_4_ + fVar91;
          auVar23 = vsubps_avx(auVar26,auVar25);
          local_de0._4_4_ = (ray->dir).field_0.m128[1];
          fVar122 = (ray->dir).field_0.m128[2];
          local_b00._4_4_ = fVar122;
          local_b00._0_4_ = fVar122;
          local_b00._8_4_ = fVar122;
          local_b00._12_4_ = fVar122;
          local_b00._16_4_ = fVar122;
          local_b00._20_4_ = fVar122;
          local_b00._24_4_ = fVar122;
          local_b00._28_4_ = fVar122;
          local_dc0._4_4_ = (ray->dir).field_0.m128[0];
          local_b60._0_4_ =
               auVar21._0_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._0_4_ + fVar122 * auVar23._0_4_;
          local_b60._4_4_ =
               auVar21._4_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._4_4_ + fVar122 * auVar23._4_4_;
          local_b60._8_4_ =
               auVar21._8_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._8_4_ + fVar122 * auVar23._8_4_;
          local_b60._12_4_ =
               auVar21._12_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._12_4_ + fVar122 * auVar23._12_4_;
          local_b60._16_4_ =
               auVar21._16_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._16_4_ + fVar122 * auVar23._16_4_;
          local_b60._20_4_ =
               auVar21._20_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._20_4_ + fVar122 * auVar23._20_4_;
          local_b60._24_4_ =
               auVar21._24_4_ * local_dc0._4_4_ +
               local_de0._4_4_ * auVar22._24_4_ + fVar122 * auVar23._24_4_;
          local_b60._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar23._28_4_;
          auVar21 = vsubps_avx(local_c20,auVar116);
          _local_b40 = vsubps_avx(local_c40,auVar18);
          fVar132 = auVar116._0_4_ + fVar15;
          fVar133 = auVar116._4_4_ + fVar17;
          fVar134 = auVar116._8_4_ + fVar96;
          fVar135 = auVar116._12_4_ + fVar105;
          fVar136 = auVar116._16_4_ + fVar107;
          fVar137 = auVar116._20_4_ + fVar109;
          fVar138 = auVar116._24_4_ + fVar13;
          fVar172 = auVar116._28_4_;
          fVar144 = fVar221 + auVar18._0_4_;
          fVar146 = fVar224 + auVar18._4_4_;
          fVar148 = fVar226 + auVar18._8_4_;
          fVar150 = fVar228 + auVar18._12_4_;
          fVar152 = fVar230 + auVar18._16_4_;
          fVar154 = fVar232 + auVar18._20_4_;
          fVar159 = fVar234 + auVar18._24_4_;
          fVar200 = local_b40._0_4_;
          fVar204 = local_b40._4_4_;
          auVar27._4_4_ = fVar204 * fVar133;
          auVar27._0_4_ = fVar200 * fVar132;
          fVar206 = local_b40._8_4_;
          auVar27._8_4_ = fVar206 * fVar134;
          fVar208 = local_b40._12_4_;
          auVar27._12_4_ = fVar208 * fVar135;
          fVar210 = local_b40._16_4_;
          auVar27._16_4_ = fVar210 * fVar136;
          fVar212 = local_b40._20_4_;
          auVar27._20_4_ = fVar212 * fVar137;
          fVar214 = local_b40._24_4_;
          auVar27._24_4_ = fVar214 * fVar138;
          auVar27._28_4_ = fVar121;
          fVar173 = auVar21._0_4_;
          fVar176 = auVar21._4_4_;
          auVar28._4_4_ = fVar176 * fVar146;
          auVar28._0_4_ = fVar173 * fVar144;
          fVar178 = auVar21._8_4_;
          auVar28._8_4_ = fVar178 * fVar148;
          fVar180 = auVar21._12_4_;
          auVar28._12_4_ = fVar180 * fVar150;
          fVar182 = auVar21._16_4_;
          auVar28._16_4_ = fVar182 * fVar152;
          fVar184 = auVar21._20_4_;
          auVar28._20_4_ = fVar184 * fVar154;
          fVar186 = auVar21._24_4_;
          auVar28._24_4_ = fVar186 * fVar159;
          auVar28._28_4_ = fVar91;
          auVar22 = vsubps_avx(auVar28,auVar27);
          auVar23 = vsubps_avx(local_c00,auVar83);
          fVar222 = auVar23._0_4_;
          fVar225 = auVar23._4_4_;
          auVar29._4_4_ = fVar225 * fVar146;
          auVar29._0_4_ = fVar222 * fVar144;
          fVar227 = auVar23._8_4_;
          auVar29._8_4_ = fVar227 * fVar148;
          fVar229 = auVar23._12_4_;
          auVar29._12_4_ = fVar229 * fVar150;
          fVar231 = auVar23._16_4_;
          auVar29._16_4_ = fVar231 * fVar152;
          fVar233 = auVar23._20_4_;
          auVar29._20_4_ = fVar233 * fVar154;
          fVar235 = auVar23._24_4_;
          auVar29._24_4_ = fVar235 * fVar159;
          auVar29._28_4_ = fVar121 + auVar18._28_4_;
          fVar144 = auVar83._0_4_ + fVar16;
          fVar146 = auVar83._4_4_ + fVar90;
          fVar148 = auVar83._8_4_ + fVar97;
          fVar150 = auVar83._12_4_ + fVar106;
          fVar152 = auVar83._16_4_ + fVar108;
          fVar154 = auVar83._20_4_ + fVar12;
          fVar159 = auVar83._24_4_ + fVar14;
          fVar170 = auVar83._28_4_ + local_c00._28_4_;
          auVar30._4_4_ = fVar204 * fVar146;
          auVar30._0_4_ = fVar200 * fVar144;
          auVar30._8_4_ = fVar206 * fVar148;
          auVar30._12_4_ = fVar208 * fVar150;
          auVar30._16_4_ = fVar210 * fVar152;
          auVar30._20_4_ = fVar212 * fVar154;
          auVar30._24_4_ = fVar214 * fVar159;
          auVar30._28_4_ = local_b40._28_4_;
          auVar23 = vsubps_avx(auVar30,auVar29);
          auVar31._4_4_ = fVar176 * fVar146;
          auVar31._0_4_ = fVar173 * fVar144;
          auVar31._8_4_ = fVar178 * fVar148;
          auVar31._12_4_ = fVar180 * fVar150;
          auVar31._16_4_ = fVar182 * fVar152;
          auVar31._20_4_ = fVar184 * fVar154;
          auVar31._24_4_ = fVar186 * fVar159;
          auVar31._28_4_ = fVar170;
          auVar32._4_4_ = fVar225 * fVar133;
          auVar32._0_4_ = fVar222 * fVar132;
          auVar32._8_4_ = fVar227 * fVar134;
          auVar32._12_4_ = fVar229 * fVar135;
          auVar32._16_4_ = fVar231 * fVar136;
          auVar32._20_4_ = fVar233 * fVar137;
          auVar32._24_4_ = fVar235 * fVar138;
          auVar32._28_4_ = fVar172 + fVar91;
          auVar24 = vsubps_avx(auVar32,auVar31);
          local_b80._0_4_ =
               local_dc0._4_4_ * auVar22._0_4_ +
               local_de0._4_4_ * auVar23._0_4_ + fVar122 * auVar24._0_4_;
          local_b80._4_4_ =
               local_dc0._4_4_ * auVar22._4_4_ +
               local_de0._4_4_ * auVar23._4_4_ + fVar122 * auVar24._4_4_;
          fStack_b78 = local_dc0._4_4_ * auVar22._8_4_ +
                       local_de0._4_4_ * auVar23._8_4_ + fVar122 * auVar24._8_4_;
          fStack_b74 = local_dc0._4_4_ * auVar22._12_4_ +
                       local_de0._4_4_ * auVar23._12_4_ + fVar122 * auVar24._12_4_;
          register0x00001310 =
               local_dc0._4_4_ * auVar22._16_4_ +
               local_de0._4_4_ * auVar23._16_4_ + fVar122 * auVar24._16_4_;
          register0x00001314 =
               local_dc0._4_4_ * auVar22._20_4_ +
               local_de0._4_4_ * auVar23._20_4_ + fVar122 * auVar24._20_4_;
          register0x00001318 =
               local_dc0._4_4_ * auVar22._24_4_ +
               local_de0._4_4_ * auVar23._24_4_ + fVar122 * auVar24._24_4_;
          register0x0000131c = auVar22._28_4_ + auVar23._28_4_ + auVar24._28_4_;
          auVar22 = vsubps_avx(auVar83,auVar94);
          fVar138 = auVar83._0_4_ + auVar94._0_4_;
          fVar144 = auVar83._4_4_ + auVar94._4_4_;
          fVar146 = auVar83._8_4_ + auVar94._8_4_;
          fVar148 = auVar83._12_4_ + auVar94._12_4_;
          fVar150 = auVar83._16_4_ + auVar94._16_4_;
          fVar152 = auVar83._20_4_ + auVar94._20_4_;
          fVar154 = auVar83._24_4_ + auVar94._24_4_;
          fVar159 = auVar83._28_4_ + auVar94._28_4_;
          auVar83 = vsubps_avx(auVar116,auVar19);
          fVar91 = auVar116._0_4_ + auVar19._0_4_;
          fVar132 = auVar116._4_4_ + auVar19._4_4_;
          fVar133 = auVar116._8_4_ + auVar19._8_4_;
          fVar134 = auVar116._12_4_ + auVar19._12_4_;
          fVar135 = auVar116._16_4_ + auVar19._16_4_;
          fVar136 = auVar116._20_4_ + auVar19._20_4_;
          fVar137 = auVar116._24_4_ + auVar19._24_4_;
          auVar94 = vsubps_avx(auVar18,auVar20);
          fVar164 = auVar18._0_4_ + auVar20._0_4_;
          fVar165 = auVar18._4_4_ + auVar20._4_4_;
          fVar166 = auVar18._8_4_ + auVar20._8_4_;
          fVar167 = auVar18._12_4_ + auVar20._12_4_;
          fVar168 = auVar18._16_4_ + auVar20._16_4_;
          fVar169 = auVar18._20_4_ + auVar20._20_4_;
          fVar121 = auVar18._24_4_ + auVar20._24_4_;
          fVar139 = auVar94._0_4_;
          fVar145 = auVar94._4_4_;
          auVar33._4_4_ = fVar145 * fVar132;
          auVar33._0_4_ = fVar139 * fVar91;
          fVar147 = auVar94._8_4_;
          auVar33._8_4_ = fVar147 * fVar133;
          fVar149 = auVar94._12_4_;
          auVar33._12_4_ = fVar149 * fVar134;
          fVar151 = auVar94._16_4_;
          auVar33._16_4_ = fVar151 * fVar135;
          fVar153 = auVar94._20_4_;
          auVar33._20_4_ = fVar153 * fVar136;
          fVar155 = auVar94._24_4_;
          auVar33._24_4_ = fVar155 * fVar137;
          auVar33._28_4_ = fVar170;
          fVar170 = auVar83._0_4_;
          fVar177 = auVar83._4_4_;
          auVar34._4_4_ = fVar177 * fVar165;
          auVar34._0_4_ = fVar170 * fVar164;
          fVar179 = auVar83._8_4_;
          auVar34._8_4_ = fVar179 * fVar166;
          fVar181 = auVar83._12_4_;
          auVar34._12_4_ = fVar181 * fVar167;
          fVar183 = auVar83._16_4_;
          auVar34._16_4_ = fVar183 * fVar168;
          fVar185 = auVar83._20_4_;
          auVar34._20_4_ = fVar185 * fVar169;
          fVar187 = auVar83._24_4_;
          auVar34._24_4_ = fVar187 * fVar121;
          auVar34._28_4_ = fVar172;
          auVar83 = vsubps_avx(auVar34,auVar33);
          fVar215 = auVar22._0_4_;
          fVar217 = auVar22._4_4_;
          auVar35._4_4_ = fVar217 * fVar165;
          auVar35._0_4_ = fVar215 * fVar164;
          fVar164 = auVar22._8_4_;
          auVar35._8_4_ = fVar164 * fVar166;
          fVar165 = auVar22._12_4_;
          auVar35._12_4_ = fVar165 * fVar167;
          fVar166 = auVar22._16_4_;
          auVar35._16_4_ = fVar166 * fVar168;
          fVar167 = auVar22._20_4_;
          auVar35._20_4_ = fVar167 * fVar169;
          fVar168 = auVar22._24_4_;
          auVar35._24_4_ = fVar168 * fVar121;
          auVar35._28_4_ = auVar18._28_4_ + auVar20._28_4_;
          auVar18._4_4_ = fVar145 * fVar144;
          auVar18._0_4_ = fVar139 * fVar138;
          auVar18._8_4_ = fVar147 * fVar146;
          auVar18._12_4_ = fVar149 * fVar148;
          auVar18._16_4_ = fVar151 * fVar150;
          auVar18._20_4_ = fVar153 * fVar152;
          auVar18._24_4_ = fVar155 * fVar154;
          auVar18._28_4_ = fVar172;
          auVar116 = vsubps_avx(auVar18,auVar35);
          auVar20._4_4_ = fVar177 * fVar144;
          auVar20._0_4_ = fVar170 * fVar138;
          auVar20._8_4_ = fVar179 * fVar146;
          auVar20._12_4_ = fVar181 * fVar148;
          auVar20._16_4_ = fVar183 * fVar150;
          auVar20._20_4_ = fVar185 * fVar152;
          auVar20._24_4_ = fVar187 * fVar154;
          auVar20._28_4_ = fVar159;
          auVar36._4_4_ = fVar217 * fVar132;
          auVar36._0_4_ = fVar215 * fVar91;
          auVar36._8_4_ = fVar164 * fVar133;
          auVar36._12_4_ = fVar165 * fVar134;
          auVar36._16_4_ = fVar166 * fVar135;
          auVar36._20_4_ = fVar167 * fVar136;
          auVar36._24_4_ = fVar168 * fVar137;
          auVar36._28_4_ = fVar172 + auVar19._28_4_;
          auVar18 = vsubps_avx(auVar36,auVar20);
          local_de0._0_4_ = local_de0._4_4_;
          fStack_dd8 = local_de0._4_4_;
          fStack_dd4 = local_de0._4_4_;
          fStack_dd0 = local_de0._4_4_;
          fStack_dcc = local_de0._4_4_;
          fStack_dc8 = local_de0._4_4_;
          fStack_dc4 = local_de0._4_4_;
          local_dc0._0_4_ = local_dc0._4_4_;
          fStack_db8 = local_dc0._4_4_;
          fStack_db4 = local_dc0._4_4_;
          fStack_db0 = local_dc0._4_4_;
          fStack_dac = local_dc0._4_4_;
          fStack_da8 = local_dc0._4_4_;
          fStack_da4 = local_dc0._4_4_;
          auVar95._0_4_ =
               local_dc0._4_4_ * auVar83._0_4_ +
               local_de0._4_4_ * auVar116._0_4_ + fVar122 * auVar18._0_4_;
          auVar95._4_4_ =
               local_dc0._4_4_ * auVar83._4_4_ +
               local_de0._4_4_ * auVar116._4_4_ + fVar122 * auVar18._4_4_;
          auVar95._8_4_ =
               local_dc0._4_4_ * auVar83._8_4_ +
               local_de0._4_4_ * auVar116._8_4_ + fVar122 * auVar18._8_4_;
          auVar95._12_4_ =
               local_dc0._4_4_ * auVar83._12_4_ +
               local_de0._4_4_ * auVar116._12_4_ + fVar122 * auVar18._12_4_;
          auVar95._16_4_ =
               local_dc0._4_4_ * auVar83._16_4_ +
               local_de0._4_4_ * auVar116._16_4_ + fVar122 * auVar18._16_4_;
          auVar95._20_4_ =
               local_dc0._4_4_ * auVar83._20_4_ +
               local_de0._4_4_ * auVar116._20_4_ + fVar122 * auVar18._20_4_;
          auVar95._24_4_ =
               local_dc0._4_4_ * auVar83._24_4_ +
               local_de0._4_4_ * auVar116._24_4_ + fVar122 * auVar18._24_4_;
          auVar95._28_4_ = fVar159 + fVar159 + auVar18._28_4_;
          local_bc0._0_4_ = auVar95._0_4_ + local_b60._0_4_ + (float)local_b80._0_4_;
          local_bc0._4_4_ = auVar95._4_4_ + local_b60._4_4_ + (float)local_b80._4_4_;
          fStack_bb8 = auVar95._8_4_ + local_b60._8_4_ + fStack_b78;
          fStack_bb4 = auVar95._12_4_ + local_b60._12_4_ + fStack_b74;
          register0x00001210 = auVar95._16_4_ + local_b60._16_4_ + register0x00001310;
          register0x00001214 = auVar95._20_4_ + local_b60._20_4_ + register0x00001314;
          register0x00001218 = auVar95._24_4_ + local_b60._24_4_ + register0x00001318;
          register0x0000121c = auVar95._28_4_ + local_b60._28_4_ + register0x0000131c;
          auVar83 = vminps_avx(local_b60,_local_b80);
          auVar83 = vminps_avx(auVar83,auVar95);
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar118._16_4_ = 0x7fffffff;
          auVar118._20_4_ = 0x7fffffff;
          auVar118._24_4_ = 0x7fffffff;
          auVar118._28_4_ = 0x7fffffff;
          _local_ba0 = vandps_avx(_local_bc0,auVar118);
          fVar91 = local_ba0._0_4_ * 1.1920929e-07;
          fVar132 = local_ba0._4_4_ * 1.1920929e-07;
          auVar19._4_4_ = fVar132;
          auVar19._0_4_ = fVar91;
          fVar133 = local_ba0._8_4_ * 1.1920929e-07;
          auVar19._8_4_ = fVar133;
          fVar134 = local_ba0._12_4_ * 1.1920929e-07;
          auVar19._12_4_ = fVar134;
          fVar135 = local_ba0._16_4_ * 1.1920929e-07;
          auVar19._16_4_ = fVar135;
          fVar136 = local_ba0._20_4_ * 1.1920929e-07;
          auVar19._20_4_ = fVar136;
          fVar137 = local_ba0._24_4_ * 1.1920929e-07;
          auVar19._24_4_ = fVar137;
          auVar19._28_4_ = 0x34000000;
          auVar162._0_8_ = CONCAT44(fVar132,fVar91) ^ 0x8000000080000000;
          auVar162._8_4_ = -fVar133;
          auVar162._12_4_ = -fVar134;
          auVar162._16_4_ = -fVar135;
          auVar162._20_4_ = -fVar136;
          auVar162._24_4_ = -fVar137;
          auVar162._28_4_ = 0xb4000000;
          auVar83 = vcmpps_avx(auVar83,auVar162,5);
          auVar18 = vmaxps_avx(local_b60,_local_b80);
          auVar116 = vmaxps_avx(auVar18,auVar95);
          auVar116 = vcmpps_avx(auVar116,auVar19,2);
          auVar116 = vorps_avx(auVar83,auVar116);
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar116 >> 0x7f,0) == '\0') &&
                (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0xbf,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar116[0x1f]) {
LAB_002c7c0b:
            auVar163 = ZEXT1664(local_d00);
            auVar171 = ZEXT1664(local_d10);
            auVar175 = ZEXT1664(local_d20);
            auVar189 = ZEXT1664(local_d30);
            auVar192 = ZEXT1664(local_d40);
            auVar202 = ZEXT1664(local_d50);
            auVar216 = ZEXT1664(local_d60);
            auVar220 = ZEXT1664(local_d70);
            auVar223 = ZEXT1664(local_d80);
            auVar143 = ZEXT1664(local_d90);
          }
          else {
            local_be0 = auVar116;
            auVar37._4_4_ = fVar176 * fVar84;
            auVar37._0_4_ = fVar173 * fVar79;
            auVar37._8_4_ = fVar178 * fVar85;
            auVar37._12_4_ = fVar180 * fVar86;
            auVar37._16_4_ = fVar182 * fVar87;
            auVar37._20_4_ = fVar184 * fVar88;
            auVar37._24_4_ = fVar186 * fVar89;
            auVar37._28_4_ = auVar83._28_4_;
            auVar38._4_4_ = fVar204 * fVar203;
            auVar38._0_4_ = fVar200 * fVar199;
            auVar38._8_4_ = fVar206 * fVar205;
            auVar38._12_4_ = fVar208 * fVar207;
            auVar38._16_4_ = fVar210 * fVar209;
            auVar38._20_4_ = fVar212 * fVar211;
            auVar38._24_4_ = fVar214 * fVar213;
            auVar38._28_4_ = 0x34000000;
            auVar19 = vsubps_avx(auVar38,auVar37);
            auVar39._4_4_ = fVar204 * fVar177;
            auVar39._0_4_ = fVar200 * fVar170;
            auVar39._8_4_ = fVar206 * fVar179;
            auVar39._12_4_ = fVar208 * fVar181;
            auVar39._16_4_ = fVar210 * fVar183;
            auVar39._20_4_ = fVar212 * fVar185;
            auVar39._24_4_ = fVar214 * fVar187;
            auVar39._28_4_ = auVar18._28_4_;
            auVar40._4_4_ = fVar176 * fVar145;
            auVar40._0_4_ = fVar173 * fVar139;
            auVar40._8_4_ = fVar178 * fVar147;
            auVar40._12_4_ = fVar180 * fVar149;
            auVar40._16_4_ = fVar182 * fVar151;
            auVar40._20_4_ = fVar184 * fVar153;
            auVar40._24_4_ = fVar186 * fVar155;
            auVar40._28_4_ = auVar21._28_4_;
            auVar20 = vsubps_avx(auVar40,auVar39);
            auVar130._8_4_ = 0x7fffffff;
            auVar130._0_8_ = 0x7fffffff7fffffff;
            auVar130._12_4_ = 0x7fffffff;
            auVar130._16_4_ = 0x7fffffff;
            auVar130._20_4_ = 0x7fffffff;
            auVar130._24_4_ = 0x7fffffff;
            auVar130._28_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar37,auVar130);
            auVar18 = vandps_avx(auVar39,auVar130);
            auVar83 = vcmpps_avx(auVar83,auVar18,1);
            local_960 = vblendvps_avx(auVar20,auVar19,auVar83);
            auVar41._4_4_ = fVar225 * fVar145;
            auVar41._0_4_ = fVar222 * fVar139;
            auVar41._8_4_ = fVar227 * fVar147;
            auVar41._12_4_ = fVar229 * fVar149;
            auVar41._16_4_ = fVar231 * fVar151;
            auVar41._20_4_ = fVar233 * fVar153;
            auVar41._24_4_ = fVar235 * fVar155;
            auVar41._28_4_ = auVar83._28_4_;
            auVar42._4_4_ = fVar225 * fVar84;
            auVar42._0_4_ = fVar222 * fVar79;
            auVar42._8_4_ = fVar227 * fVar85;
            auVar42._12_4_ = fVar229 * fVar86;
            auVar42._16_4_ = fVar231 * fVar87;
            auVar42._20_4_ = fVar233 * fVar88;
            auVar42._24_4_ = fVar235 * fVar89;
            auVar42._28_4_ = auVar19._28_4_;
            auVar43._4_4_ = fVar193 * fVar204;
            auVar43._0_4_ = fVar190 * fVar200;
            auVar43._8_4_ = fVar194 * fVar206;
            auVar43._12_4_ = fVar195 * fVar208;
            auVar43._16_4_ = fVar196 * fVar210;
            auVar43._20_4_ = fVar197 * fVar212;
            auVar43._24_4_ = fVar198 * fVar214;
            auVar43._28_4_ = fVar122;
            auVar19 = vsubps_avx(auVar42,auVar43);
            auVar44._4_4_ = fVar204 * fVar217;
            auVar44._0_4_ = fVar200 * fVar215;
            auVar44._8_4_ = fVar206 * fVar164;
            auVar44._12_4_ = fVar208 * fVar165;
            auVar44._16_4_ = fVar210 * fVar166;
            auVar44._20_4_ = fVar212 * fVar167;
            auVar44._24_4_ = fVar214 * fVar168;
            auVar44._28_4_ = auVar18._28_4_;
            auVar20 = vsubps_avx(auVar44,auVar41);
            auVar83 = vandps_avx(auVar43,auVar130);
            auVar18 = vandps_avx(auVar41,auVar130);
            auVar83 = vcmpps_avx(auVar83,auVar18,1);
            local_940 = vblendvps_avx(auVar20,auVar19,auVar83);
            auVar45._4_4_ = fVar176 * fVar217;
            auVar45._0_4_ = fVar173 * fVar215;
            auVar45._8_4_ = fVar178 * fVar164;
            auVar45._12_4_ = fVar180 * fVar165;
            auVar45._16_4_ = fVar182 * fVar166;
            auVar45._20_4_ = fVar184 * fVar167;
            auVar45._24_4_ = fVar186 * fVar168;
            auVar45._28_4_ = auVar83._28_4_;
            auVar46._4_4_ = fVar193 * fVar176;
            auVar46._0_4_ = fVar190 * fVar173;
            auVar46._8_4_ = fVar194 * fVar178;
            auVar46._12_4_ = fVar195 * fVar180;
            auVar46._16_4_ = fVar196 * fVar182;
            auVar46._20_4_ = fVar197 * fVar184;
            auVar46._24_4_ = fVar198 * fVar186;
            auVar46._28_4_ = auVar19._28_4_;
            auVar47._4_4_ = fVar225 * fVar203;
            auVar47._0_4_ = fVar222 * fVar199;
            auVar47._8_4_ = fVar227 * fVar205;
            auVar47._12_4_ = fVar229 * fVar207;
            auVar47._16_4_ = fVar231 * fVar209;
            auVar47._20_4_ = fVar233 * fVar211;
            auVar47._24_4_ = fVar235 * fVar213;
            auVar47._28_4_ = auVar94._28_4_;
            auVar48._4_4_ = fVar225 * fVar177;
            auVar48._0_4_ = fVar222 * fVar170;
            auVar48._8_4_ = fVar227 * fVar179;
            auVar48._12_4_ = fVar229 * fVar181;
            auVar48._16_4_ = fVar231 * fVar183;
            auVar48._20_4_ = fVar233 * fVar185;
            auVar48._24_4_ = fVar235 * fVar187;
            auVar48._28_4_ = uStack_b04;
            auVar94 = vsubps_avx(auVar46,auVar47);
            auVar19 = vsubps_avx(auVar48,auVar45);
            auVar83 = vandps_avx(auVar47,auVar130);
            auVar18 = vandps_avx(auVar45,auVar130);
            auVar18 = vcmpps_avx(auVar83,auVar18,1);
            local_920 = vblendvps_avx(auVar19,auVar94,auVar18);
            auVar81 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
            fVar79 = local_920._0_4_;
            fVar84 = local_920._4_4_;
            fVar85 = local_920._8_4_;
            fVar86 = local_920._12_4_;
            fVar87 = local_920._16_4_;
            fVar88 = local_920._20_4_;
            fVar89 = local_920._24_4_;
            fVar138 = local_940._0_4_;
            fVar144 = local_940._4_4_;
            fVar146 = local_940._8_4_;
            fVar148 = local_940._12_4_;
            fVar150 = local_940._16_4_;
            fVar152 = local_940._20_4_;
            fVar154 = local_940._24_4_;
            fVar159 = local_960._0_4_;
            fVar164 = local_960._4_4_;
            fVar165 = local_960._8_4_;
            fVar166 = local_960._12_4_;
            fVar167 = local_960._16_4_;
            fVar168 = local_960._20_4_;
            fVar169 = local_960._24_4_;
            fVar91 = fVar159 * local_dc0._4_4_ + fVar138 * local_de0._4_4_ + fVar79 * fVar122;
            fVar132 = fVar164 * local_dc0._4_4_ + fVar144 * local_de0._4_4_ + fVar84 * fVar122;
            fVar133 = fVar165 * local_dc0._4_4_ + fVar146 * local_de0._4_4_ + fVar85 * fVar122;
            fVar134 = fVar166 * local_dc0._4_4_ + fVar148 * local_de0._4_4_ + fVar86 * fVar122;
            fVar135 = fVar167 * local_dc0._4_4_ + fVar150 * local_de0._4_4_ + fVar87 * fVar122;
            fVar136 = fVar168 * local_dc0._4_4_ + fVar152 * local_de0._4_4_ + fVar88 * fVar122;
            fVar122 = fVar169 * local_dc0._4_4_ + fVar154 * local_de0._4_4_ + fVar89 * fVar122;
            fVar137 = auVar94._28_4_ + auVar94._28_4_ + 0.0;
            auVar119._0_4_ = fVar91 + fVar91;
            auVar119._4_4_ = fVar132 + fVar132;
            auVar119._8_4_ = fVar133 + fVar133;
            auVar119._12_4_ = fVar134 + fVar134;
            auVar119._16_4_ = fVar135 + fVar135;
            auVar119._20_4_ = fVar136 + fVar136;
            auVar119._24_4_ = fVar122 + fVar122;
            auVar119._28_4_ = fVar137 + fVar137;
            fVar91 = auVar83._28_4_;
            auVar83 = vrcpps_avx(auVar119);
            fVar132 = fVar159 * fVar16 + fVar138 * fVar15 + fVar79 * fVar221;
            fVar133 = fVar164 * fVar90 + fVar144 * fVar17 + fVar84 * fVar224;
            fVar134 = fVar165 * fVar97 + fVar146 * fVar96 + fVar85 * fVar226;
            fVar105 = fVar166 * fVar106 + fVar148 * fVar105 + fVar86 * fVar228;
            fVar106 = fVar167 * fVar108 + fVar150 * fVar107 + fVar87 * fVar230;
            fVar107 = fVar168 * fVar12 + fVar152 * fVar109 + fVar88 * fVar232;
            fVar108 = fVar169 * fVar14 + fVar154 * fVar13 + fVar89 * fVar234;
            fVar109 = fVar91 + fVar91 + fVar137;
            fVar122 = auVar83._0_4_;
            fVar15 = auVar83._4_4_;
            auVar49._4_4_ = auVar119._4_4_ * fVar15;
            auVar49._0_4_ = auVar119._0_4_ * fVar122;
            fVar16 = auVar83._8_4_;
            auVar49._8_4_ = auVar119._8_4_ * fVar16;
            fVar17 = auVar83._12_4_;
            auVar49._12_4_ = auVar119._12_4_ * fVar17;
            fVar90 = auVar83._16_4_;
            auVar49._16_4_ = auVar119._16_4_ * fVar90;
            fVar96 = auVar83._20_4_;
            auVar49._20_4_ = auVar119._20_4_ * fVar96;
            fVar97 = auVar83._24_4_;
            auVar49._24_4_ = auVar119._24_4_ * fVar97;
            auVar49._28_4_ = fVar91;
            auVar131._8_4_ = 0x3f800000;
            auVar131._0_8_ = 0x3f8000003f800000;
            auVar131._12_4_ = 0x3f800000;
            auVar131._16_4_ = 0x3f800000;
            auVar131._20_4_ = 0x3f800000;
            auVar131._24_4_ = 0x3f800000;
            auVar131._28_4_ = 0x3f800000;
            auVar83 = vsubps_avx(auVar131,auVar49);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar157._4_4_ = uVar3;
            auVar157._0_4_ = uVar3;
            auVar157._8_4_ = uVar3;
            auVar157._12_4_ = uVar3;
            auVar157._16_4_ = uVar3;
            auVar157._20_4_ = uVar3;
            auVar157._24_4_ = uVar3;
            auVar157._28_4_ = uVar3;
            local_8a0._4_4_ = (fVar133 + fVar133) * (fVar15 + fVar15 * auVar83._4_4_);
            local_8a0._0_4_ = (fVar132 + fVar132) * (fVar122 + fVar122 * auVar83._0_4_);
            local_8a0._8_4_ = (fVar134 + fVar134) * (fVar16 + fVar16 * auVar83._8_4_);
            local_8a0._12_4_ = (fVar105 + fVar105) * (fVar17 + fVar17 * auVar83._12_4_);
            local_8a0._16_4_ = (fVar106 + fVar106) * (fVar90 + fVar90 * auVar83._16_4_);
            local_8a0._20_4_ = (fVar107 + fVar107) * (fVar96 + fVar96 * auVar83._20_4_);
            local_8a0._24_4_ = (fVar108 + fVar108) * (fVar97 + fVar97 * auVar83._24_4_);
            local_8a0._28_4_ = fVar109 + fVar109;
            auVar83 = vcmpps_avx(auVar157,local_8a0,2);
            fVar122 = ray->tfar;
            auVar158._4_4_ = fVar122;
            auVar158._0_4_ = fVar122;
            auVar158._8_4_ = fVar122;
            auVar158._12_4_ = fVar122;
            auVar158._16_4_ = fVar122;
            auVar158._20_4_ = fVar122;
            auVar158._24_4_ = fVar122;
            auVar158._28_4_ = fVar122;
            auVar116 = vcmpps_avx(local_8a0,auVar158,2);
            auVar83 = vandps_avx(auVar116,auVar83);
            auVar116 = vcmpps_avx(auVar119,_DAT_01faff00,4);
            auVar83 = vandps_avx(auVar83,auVar116);
            auVar123 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
            auVar81 = vpand_avx(auVar123,auVar81);
            auVar123 = vpmovsxwd_avx(auVar81);
            auVar82 = vpshufd_avx(auVar81,0xee);
            auVar82 = vpmovsxwd_avx(auVar82);
            local_900._16_16_ = auVar82;
            local_900._0_16_ = auVar123;
            if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_900 >> 0x7f,0) == '\0') &&
                  (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar82 >> 0x3f,0) == '\0') &&
                (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar82[0xf]) goto LAB_002c7c0b;
            local_9c0 = local_b60._0_4_;
            fStack_9bc = local_b60._4_4_;
            fStack_9b8 = local_b60._8_4_;
            fStack_9b4 = local_b60._12_4_;
            fStack_9b0 = local_b60._16_4_;
            fStack_9ac = local_b60._20_4_;
            fStack_9a8 = local_b60._24_4_;
            fStack_9a4 = local_b60._28_4_;
            local_9a0 = (float)local_b80._0_4_;
            fStack_99c = (float)local_b80._4_4_;
            fStack_998 = fStack_b78;
            fStack_994 = fStack_b74;
            fStack_990 = register0x00001310;
            fStack_98c = register0x00001314;
            fStack_988 = register0x00001318;
            fStack_984 = register0x0000131c;
            local_980 = _local_bc0;
            local_820 = local_a20;
            auVar83 = vrcpps_avx(_local_bc0);
            fVar122 = auVar83._0_4_;
            fVar15 = auVar83._4_4_;
            auVar50._4_4_ = (float)local_bc0._4_4_ * fVar15;
            auVar50._0_4_ = (float)local_bc0._0_4_ * fVar122;
            fVar16 = auVar83._8_4_;
            auVar50._8_4_ = fStack_bb8 * fVar16;
            fVar17 = auVar83._12_4_;
            auVar50._12_4_ = fStack_bb4 * fVar17;
            fVar90 = auVar83._16_4_;
            auVar50._16_4_ = register0x00001210 * fVar90;
            fVar96 = auVar83._20_4_;
            auVar50._20_4_ = register0x00001214 * fVar96;
            fVar97 = auVar83._24_4_;
            auVar50._24_4_ = register0x00001218 * fVar97;
            auVar50._28_4_ = auVar82._12_4_;
            auVar142._8_4_ = 0x3f800000;
            auVar142._0_8_ = 0x3f8000003f800000;
            auVar142._12_4_ = 0x3f800000;
            auVar142._16_4_ = 0x3f800000;
            auVar142._20_4_ = 0x3f800000;
            auVar142._24_4_ = 0x3f800000;
            auVar142._28_4_ = 0x3f800000;
            auVar116 = vsubps_avx(auVar142,auVar50);
            auVar104._0_4_ = fVar122 + fVar122 * auVar116._0_4_;
            auVar104._4_4_ = fVar15 + fVar15 * auVar116._4_4_;
            auVar104._8_4_ = fVar16 + fVar16 * auVar116._8_4_;
            auVar104._12_4_ = fVar17 + fVar17 * auVar116._12_4_;
            auVar104._16_4_ = fVar90 + fVar90 * auVar116._16_4_;
            auVar104._20_4_ = fVar96 + fVar96 * auVar116._20_4_;
            auVar104._24_4_ = fVar97 + fVar97 * auVar116._24_4_;
            auVar104._28_4_ = auVar83._28_4_ + auVar116._28_4_;
            auVar120._8_4_ = 0x219392ef;
            auVar120._0_8_ = 0x219392ef219392ef;
            auVar120._12_4_ = 0x219392ef;
            auVar120._16_4_ = 0x219392ef;
            auVar120._20_4_ = 0x219392ef;
            auVar120._24_4_ = 0x219392ef;
            auVar120._28_4_ = 0x219392ef;
            auVar116 = vcmpps_avx(_local_ba0,auVar120,5);
            auVar83 = vandps_avx(auVar116,auVar104);
            auVar51._4_4_ = local_b60._4_4_ * auVar83._4_4_;
            auVar51._0_4_ = local_b60._0_4_ * auVar83._0_4_;
            auVar51._8_4_ = local_b60._8_4_ * auVar83._8_4_;
            auVar51._12_4_ = local_b60._12_4_ * auVar83._12_4_;
            auVar51._16_4_ = local_b60._16_4_ * auVar83._16_4_;
            auVar51._20_4_ = local_b60._20_4_ * auVar83._20_4_;
            auVar51._24_4_ = local_b60._24_4_ * auVar83._24_4_;
            auVar51._28_4_ = auVar116._28_4_;
            auVar116 = vminps_avx(auVar51,auVar142);
            auVar52._4_4_ = (float)local_b80._4_4_ * auVar83._4_4_;
            auVar52._0_4_ = (float)local_b80._0_4_ * auVar83._0_4_;
            auVar52._8_4_ = fStack_b78 * auVar83._8_4_;
            auVar52._12_4_ = fStack_b74 * auVar83._12_4_;
            auVar52._16_4_ = register0x00001310 * auVar83._16_4_;
            auVar52._20_4_ = register0x00001314 * auVar83._20_4_;
            auVar52._24_4_ = register0x00001318 * auVar83._24_4_;
            auVar52._28_4_ = auVar83._28_4_;
            auVar83 = vminps_avx(auVar52,auVar142);
            auVar18 = vsubps_avx(auVar142,auVar116);
            auVar94 = vsubps_avx(auVar142,auVar83);
            local_8c0 = vblendvps_avx(auVar83,auVar18,local_a20);
            local_8e0 = vblendvps_avx(auVar116,auVar94,local_a20);
            fVar122 = local_a40._0_4_;
            fVar15 = local_a40._4_4_;
            local_880._4_4_ = fVar164 * fVar15;
            local_880._0_4_ = fVar159 * fVar122;
            fVar16 = local_a40._8_4_;
            local_880._8_4_ = fVar165 * fVar16;
            fVar17 = local_a40._12_4_;
            local_880._12_4_ = fVar166 * fVar17;
            fVar90 = local_a40._16_4_;
            local_880._16_4_ = fVar167 * fVar90;
            fVar96 = local_a40._20_4_;
            local_880._20_4_ = fVar168 * fVar96;
            fVar97 = local_a40._24_4_;
            local_880._24_4_ = fVar169 * fVar97;
            local_880._28_4_ = local_8c0._28_4_;
            local_860._4_4_ = fVar144 * fVar15;
            local_860._0_4_ = fVar138 * fVar122;
            local_860._8_4_ = fVar146 * fVar16;
            local_860._12_4_ = fVar148 * fVar17;
            local_860._16_4_ = fVar150 * fVar90;
            local_860._20_4_ = fVar152 * fVar96;
            local_860._24_4_ = fVar154 * fVar97;
            local_860._28_4_ = local_8e0._28_4_;
            local_840[0] = fVar122 * fVar79;
            local_840[1] = fVar15 * fVar84;
            local_840[2] = fVar16 * fVar85;
            local_840[3] = fVar17 * fVar86;
            fStack_830 = fVar90 * fVar87;
            fStack_82c = fVar96 * fVar88;
            fStack_828 = fVar97 * fVar89;
            uStack_824 = local_920._28_4_;
            auVar81 = vpsllw_avx(auVar81,0xf);
            auVar81 = vpacksswb_avx(auVar81,auVar81);
            uVar56 = (ulong)(byte)(SUB161(auVar81 >> 7,0) & 1 | (SUB161(auVar81 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar81 >> 0x3f,0) << 7);
            auVar163 = ZEXT1664(local_d00);
            auVar171 = ZEXT1664(local_d10);
            auVar175 = ZEXT1664(local_d20);
            auVar189 = ZEXT1664(local_d30);
            auVar192 = ZEXT1664(local_d40);
            auVar202 = ZEXT1664(local_d50);
            auVar216 = ZEXT1664(local_d60);
            auVar220 = ZEXT1664(local_d70);
            auVar223 = ZEXT1664(local_d80);
            auVar143 = ZEXT1664(local_d90);
            _local_cf0 = auVar115;
            _local_ce0 = auVar126;
            _local_b20 = auVar103;
            _local_a90 = auVar127;
            _local_a80 = auVar53;
            _local_a70 = auVar54;
            _local_a60 = auVar55;
            do {
              uVar60 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                }
              }
              local_c88 = *(uint *)((long)&local_9e0 + uVar60 * 4);
              uVar62 = CONCAT44(0,local_c88);
              local_de0 = uVar62;
              pGVar8 = (pSVar6->geometries).items[uVar62].ptr;
              if ((pGVar8->mask & ray->mask) == 0) {
                uVar56 = uVar56 ^ 1L << (uVar60 & 0x3f);
              }
              else {
                local_dc0 = uVar60;
                pRVar73 = context->args;
                if ((pRVar73->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c7cbb;
                local_c00._0_8_ = uVar56;
                local_c70.context = context->user;
                local_ca0 = *(undefined4 *)(local_880 + uVar60 * 4);
                local_c9c = *(undefined4 *)(local_860 + uVar60 * 4);
                local_c98 = local_840[uVar60];
                local_c94 = *(undefined4 *)(local_8e0 + uVar60 * 4);
                local_c90 = *(undefined4 *)(local_8c0 + uVar60 * 4);
                local_c8c = *(undefined4 *)((long)&local_a00 + uVar60 * 4);
                local_c84 = (local_c70.context)->instID[0];
                local_c80 = (local_c70.context)->instPrimID[0];
                local_de0._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_8a0 + uVar60 * 4);
                local_de4 = -1;
                local_c70.valid = &local_de4;
                local_c70.geometryUserPtr = pGVar8->userPtr;
                local_c70.hit = (RTCHitN *)&local_ca0;
                local_c70.N = 1;
                local_c20._0_8_ = pGVar8;
                local_c70.ray = (RTCRayN *)ray;
                if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002c7b15:
                  if ((pRVar73->filter == (RTCFilterFunctionN)0x0) ||
                     ((((pRVar73->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT &&
                       ((*(byte *)(local_c20._0_8_ + 0x3e) & 0x40) == 0)) ||
                      ((*pRVar73->filter)(&local_c70), *local_c70.valid != 0)))) {
LAB_002c7cbb:
                    ray->tfar = -INFINITY;
                    return;
                  }
                }
                else {
                  local_c40._0_8_ = pRVar73;
                  (*pGVar8->occlusionFilterN)(&local_c70);
                  pRVar73 = (RTCIntersectArguments *)local_c40._0_8_;
                  if (*local_c70.valid != 0) goto LAB_002c7b15;
                }
                ray->tfar = (float)local_de0;
                uVar56 = local_c00._0_8_ ^ 1L << (local_dc0 & 0x3f);
                auVar163 = ZEXT1664(local_d00);
                auVar171 = ZEXT1664(local_d10);
                auVar175 = ZEXT1664(local_d20);
                auVar189 = ZEXT1664(local_d30);
                auVar192 = ZEXT1664(local_d40);
                auVar202 = ZEXT1664(local_d50);
                auVar216 = ZEXT1664(local_d60);
                auVar220 = ZEXT1664(local_d70);
                auVar223 = ZEXT1664(local_d80);
                auVar143 = ZEXT1664(local_d90);
              }
            } while (uVar56 != 0);
          }
          local_cc8 = local_cc8 + 1;
        } while (local_cc8 != local_cd0);
      }
LAB_002c7ca3:
    } while (puVar70 != &local_800);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }